

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.h
# Opt level: O0

void __thiscall
pbrt::PiecewiseConstant2D::PiecewiseConstant2D
          (PiecewiseConstant2D *this,span<const_float> func,int nx,int ny,Bounds2f domain,
          Allocator alloc)

{
  Allocator alloc_00;
  PiecewiseConstant1D *this_00;
  int in_ECX;
  Tuple2<pbrt::Point2,_float> *in_RDI;
  int in_R8D;
  undefined1 in_ZMM0 [64];
  undefined1 in_ZMM1 [64];
  span<const_float> sVar1;
  int y_1;
  vector<float,_std::allocator<float>_> marginalFunc;
  int y;
  size_t vb;
  size_t va;
  PiecewiseConstant1D *in_stack_fffffffffffffe78;
  PiecewiseConstant1D *in_stack_fffffffffffffe80;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffe88;
  span<const_float> *in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe98;
  int iVar2;
  undefined4 in_stack_fffffffffffffe9c;
  vector<pbrt::PiecewiseConstant1D,_pstd::pmr::polymorphic_allocator<pbrt::PiecewiseConstant1D>_>
  *in_stack_fffffffffffffea0;
  undefined1 *__n;
  undefined4 in_stack_fffffffffffffeb0;
  int in_stack_fffffffffffffeb4;
  PiecewiseConstant1D *in_stack_fffffffffffffec8;
  Allocator in_stack_fffffffffffffed0;
  vector<pbrt::PiecewiseConstant1D,_pstd::pmr::polymorphic_allocator<pbrt::PiecewiseConstant1D>_>
  *this_01;
  polymorphic_allocator<pbrt::PiecewiseConstant1D> *alloc_01;
  LogLevel level;
  char (*in_stack_ffffffffffffff00) [12];
  unsigned_long *in_stack_ffffffffffffff08;
  char (*in_stack_ffffffffffffff10) [24];
  unsigned_long *in_stack_ffffffffffffff18;
  int local_9c;
  undefined1 local_98 [24];
  span<const_float> local_80;
  Float in_stack_ffffffffffffff90;
  Float min;
  span<const_float> in_stack_ffffffffffffffa8;
  polymorphic_allocator<pbrt::PiecewiseConstant1D> local_40;
  int local_38;
  int local_34;
  Tuple2<pbrt::Point2,_float> local_20;
  Tuple2<pbrt::Point2,_float> TStack_18;
  span<const_float> local_10;
  
  local_20 = (Tuple2<pbrt::Point2,_float>)vmovlpd_avx(in_ZMM0._0_16_);
  TStack_18 = (Tuple2<pbrt::Point2,_float>)vmovlpd_avx(in_ZMM1._0_16_);
  *in_RDI = local_20;
  in_RDI[1] = TStack_18;
  this_01 = (vector<pbrt::PiecewiseConstant1D,_pstd::pmr::polymorphic_allocator<pbrt::PiecewiseConstant1D>_>
             *)(in_RDI + 2);
  alloc_01 = &local_40;
  local_38 = in_R8D;
  local_34 = in_ECX;
  pstd::pmr::polymorphic_allocator<pbrt::PiecewiseConstant1D>::polymorphic_allocator<std::byte>
            ((polymorphic_allocator<pbrt::PiecewiseConstant1D> *)in_stack_fffffffffffffe80,
             (polymorphic_allocator<std::byte> *)in_stack_fffffffffffffe78);
  pstd::
  vector<pbrt::PiecewiseConstant1D,_pstd::pmr::polymorphic_allocator<pbrt::PiecewiseConstant1D>_>::
  vector(this_01,alloc_01);
  iVar2 = (int)((ulong)alloc_01 >> 0x20);
  level = (LogLevel)((ulong)(in_RDI + 6) >> 0x20);
  PiecewiseConstant1D::PiecewiseConstant1D(in_stack_fffffffffffffec8,in_stack_fffffffffffffed0);
  alloc_00.memoryResource = (memory_resource *)pstd::span<const_float>::size(&local_10);
  this_00 = (PiecewiseConstant1D *)((long)local_34 * (long)local_38);
  if ((PiecewiseConstant1D *)alloc_00.memoryResource != this_00) {
    LogFatal<char_const(&)[12],char_const(&)[24],char_const(&)[12],unsigned_long&,char_const(&)[24],unsigned_long&>
              (level,(char *)in_RDI,iVar2,(char *)this_01,
               (char (*) [12])in_stack_fffffffffffffed0.memoryResource,
               (char (*) [24])in_stack_fffffffffffffec8,in_stack_ffffffffffffff00,
               in_stack_ffffffffffffff08,in_stack_ffffffffffffff10,in_stack_ffffffffffffff18);
  }
  pstd::
  vector<pbrt::PiecewiseConstant1D,_pstd::pmr::polymorphic_allocator<pbrt::PiecewiseConstant1D>_>::
  reserve(in_stack_fffffffffffffea0,CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
  for (min = 0.0; (int)min < local_38; min = (Float)((int)min + 1)) {
    sVar1 = pstd::span<const_float>::subspan
                      ((span<const_float> *)in_stack_fffffffffffffea0,
                       CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                       (size_t)in_stack_fffffffffffffe90);
    in_stack_fffffffffffffeb4 = 0;
    local_80 = sVar1;
    Tuple2<pbrt::Point2,_float>::operator[](&local_20,0);
    Tuple2<pbrt::Point2,_float>::operator[](&TStack_18,in_stack_fffffffffffffeb4);
    pstd::
    vector<pbrt::PiecewiseConstant1D,pstd::pmr::polymorphic_allocator<pbrt::PiecewiseConstant1D>>::
    emplace_back<pstd::span<float_const>,float&,float&,pstd::pmr::polymorphic_allocator<std::byte>&>
              (in_stack_fffffffffffffea0,
               (span<const_float> *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
               (float *)in_stack_fffffffffffffe90,(float *)in_stack_fffffffffffffe88,
               (polymorphic_allocator<std::byte> *)in_stack_fffffffffffffe80);
  }
  __n = local_98;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)0x4e8955);
  std::vector<float,_std::allocator<float>_>::reserve
            ((vector<float,_std::allocator<float>_> *)
             CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),(size_type)__n);
  for (local_9c = 0; local_9c < local_38; local_9c = local_9c + 1) {
    pstd::
    vector<pbrt::PiecewiseConstant1D,_pstd::pmr::polymorphic_allocator<pbrt::PiecewiseConstant1D>_>
    ::operator[]((vector<pbrt::PiecewiseConstant1D,_pstd::pmr::polymorphic_allocator<pbrt::PiecewiseConstant1D>_>
                  *)(in_RDI + 2),(long)local_9c);
    std::vector<float,_std::allocator<float>_>::push_back
              ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffe90,
               (value_type_conflict *)in_stack_fffffffffffffe88);
  }
  pstd::span<float_const>::
  span<std::vector<float,std::allocator<float>>,void,std::vector<float,std::allocator<float>>>
            (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  iVar2 = 1;
  Tuple2<pbrt::Point2,_float>::operator[](&local_20,1);
  Tuple2<pbrt::Point2,_float>::operator[](&TStack_18,iVar2);
  PiecewiseConstant1D::PiecewiseConstant1D
            (this_00,in_stack_ffffffffffffffa8,min,in_stack_ffffffffffffff90,alloc_00);
  PiecewiseConstant1D::operator=(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
  PiecewiseConstant1D::~PiecewiseConstant1D(in_stack_fffffffffffffe80);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffe90);
  return;
}

Assistant:

PiecewiseConstant2D(pstd::span<const Float> func, int nx, int ny, Bounds2f domain,
                        Allocator alloc = {})
        : domain(domain), pConditionalY(alloc), pMarginal(alloc) {
        CHECK_EQ(func.size(), (size_t)nx * (size_t)ny);
        pConditionalY.reserve(ny);
        for (int y = 0; y < ny; ++y)
            // Compute conditional sampling distribution for $\tilde{y}$
            // TODO: emplace_back is key so the alloc sticks. WHY?
            pConditionalY.emplace_back(func.subspan(y * nx, nx), domain.pMin[0],
                                       domain.pMax[0], alloc);

        // Compute marginal sampling distribution $p[\tilde{y}]$
        std::vector<Float> marginalFunc;
        marginalFunc.reserve(ny);
        for (int y = 0; y < ny; ++y)
            marginalFunc.push_back(pConditionalY[y].funcInt);
        pMarginal =
            PiecewiseConstant1D(marginalFunc, domain.pMin[1], domain.pMax[1], alloc);
    }